

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::Func::~Func(Func *this)

{
  Func *this_local;
  
  intrusive_list<wabt::Expr>::~intrusive_list(&this->exprs);
  BindingHash::~BindingHash(&this->bindings);
  LocalTypes::~LocalTypes(&this->local_types);
  FuncDeclaration::~FuncDeclaration(&this->decl);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

explicit Func(std::string_view name) : name(name) {}